

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O3

string * __thiscall
duckdb::GetSeparator_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,string_t *input)

{
  int iVar1;
  pointer pFVar2;
  string *extraout_RAX;
  string *psVar3;
  string *extraout_RAX_00;
  char *pcVar4;
  pointer *__ptr;
  duckdb *pdVar5;
  string option;
  string system_sep;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> local_68;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string *local_40 [4];
  undefined4 extraout_var;
  
  if ((ulong)*(uint *)this < 0xd) {
    pdVar5 = this + 4;
  }
  else {
    pdVar5 = *(duckdb **)(this + 8);
  }
  local_60[0] = local_50;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,pdVar5,pdVar5 + *(uint *)this);
  FileSystem::CreateLocal();
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)&local_68);
  (*pFVar2->_vptr_FileSystem[0x19])(local_40,pFVar2,local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = ::std::__cxx11::string::compare((char *)local_60);
  if (iVar1 == 0) {
    ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)local_60);
    if (iVar1 == 0) {
      pcVar4 = "/";
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)local_60);
      pcVar4 = "/\\";
      if (iVar1 == 0) {
        pcVar4 = "\\";
      }
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)pcVar4);
  }
  psVar3 = (string *)(local_40 + 2);
  if (local_40[0] != psVar3) {
    operator_delete(local_40[0]);
    psVar3 = extraout_RAX;
  }
  if (local_68._M_head_impl != (FileSystem *)0x0) {
    iVar1 = (*(local_68._M_head_impl)->_vptr_FileSystem[1])();
    psVar3 = (string *)CONCAT44(extraout_var,iVar1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

static string GetSeparator(const string_t &input) {
	string option = input.GetString();

	// system's path separator
	auto fs = FileSystem::CreateLocal();
	auto system_sep = fs->PathSeparator(option);

	string separator;
	if (option == "system") {
		separator = system_sep;
	} else if (option == "forward_slash") {
		separator = "/";
	} else if (option == "backslash") {
		separator = "\\";
	} else { // both_slash (default)
		separator = "/\\";
	}
	return separator;
}